

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O1

void __thiscall SystemCatalog::listTypes(SystemCatalog *this,ostream *stream)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->types)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void SystemCatalog::listTypes(ostream &stream) {

    for (const auto &type : this->types) {
        stream << type.typeName << endl;
    }
}